

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft.cpp
# Opt level: O0

int cfttree(int n,int j,int k,double *a,int nw,double *w)

{
  int local_3c;
  uint local_38;
  int m;
  int isplt;
  int i;
  double *w_local;
  int nw_local;
  double *a_local;
  int k_local;
  int j_local;
  int n_local;
  
  local_3c = n;
  m = k;
  if ((k & 3U) == 0) {
    for (; (m & 3U) == 0; m = m >> 2) {
      local_3c = local_3c << 2;
    }
    local_38 = m & 1;
    if (local_38 == 0) {
      for (; 0x80 < local_3c; local_3c = local_3c >> 2) {
        cftmdl2(local_3c,a + (j - local_3c),w + (nw - local_3c));
      }
    }
    else {
      for (; 0x80 < local_3c; local_3c = local_3c >> 2) {
        cftmdl1(local_3c,a + (j - local_3c),w + (nw - (local_3c >> 1)));
      }
    }
  }
  else {
    local_38 = k & 1;
    if (local_38 == 0) {
      cftmdl2(n,a + (j - n),w + (nw - n));
    }
    else {
      cftmdl1(n,a + (j - n),w + (nw - (n >> 1)));
    }
  }
  return local_38;
}

Assistant:

int cfttree(int n, int j, int k, double *a, int nw, double *w) {
  void cftmdl1(int n, double *a, double *w);
  void cftmdl2(int n, double *a, double *w);
  int i, isplt, m;

  if ((k & 3) != 0) {
    isplt = k & 1;
    if (isplt != 0) {
      cftmdl1(n, &a[j - n], &w[nw - (n >> 1)]);
    } else {
      cftmdl2(n, &a[j - n], &w[nw - n]);
    }
  } else {
    m = n;
    for (i = k; (i & 3) == 0; i >>= 2) {
      m <<= 2;
    }
    isplt = i & 1;
    if (isplt != 0) {
      while (m > 128) {
        cftmdl1(m, &a[j - m], &w[nw - (m >> 1)]);
        m >>= 2;
      }
    } else {
      while (m > 128) {
        cftmdl2(m, &a[j - m], &w[nw - m]);
        m >>= 2;
      }
    }
  }
  return isplt;
}